

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O1

void Omega_h::transfer_integ_error
               (Mesh *old_mesh,Mesh *new_mesh,CavsByBdryStatus *cavs,Reals *old_elem_densities,
               Reals *new_elem_densities,string *error_name,LOs *same_ents2old_ents,
               LOs *same_ents2new_ents,ConservedBools conserved_bools)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  CommPtr *pCVar2;
  int *piVar3;
  LOs *pLVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  undefined8 uVar9;
  element_type *peVar10;
  Alloc *pAVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  LO LVar13;
  int width;
  Int width_00;
  Tag<double> *pTVar14;
  Now b;
  pointer psVar15;
  _func_int **pp_Var16;
  element_type *peVar17;
  Real RVar18;
  Graph keys2new_elems;
  Graph keys2old_elems;
  Read<double> new_cav_elem_sizes;
  Reals new_elem_errors;
  Read<double> old_cav_elem_densities;
  Write<double> new_elem_errors_w;
  Reals new_cav_elem_integrals;
  Reals old_elem_sizes;
  Reals cav_error_densities_1;
  Read<double> old_cav_elem_sizes;
  Read<double> new_cav_sizes_1;
  Reals old_cav_elem_integrals;
  Read<double> new_cav_elem_densities;
  Reals new_elem_sizes;
  Read<double> cav_elem_error_densities_1;
  Read<double> old_cav_errors;
  Read<double> same_errors;
  Read<double> old_elem_errors;
  Reals cav_elem_errors;
  Read<double> cav_elem_error_densities;
  Reals cav_error_densities;
  Read<double> new_cav_sizes;
  Read<double> cav_errors;
  Read<double> new_cav_integrals;
  Read<double> old_cav_integrals;
  undefined1 local_5e8 [36];
  Int local_5c4;
  element_type *local_5c0;
  element_type *local_5b8;
  element_type *local_5b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5a8;
  element_type *local_5a0;
  element_type *local_598;
  element_type *local_590;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_588;
  Reals local_580;
  undefined1 local_570 [32];
  element_type *local_550;
  element_type *local_548;
  element_type *local_540;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_538;
  element_type local_530;
  LOs local_500;
  Read<signed_char> local_4f0;
  LOs local_4e0;
  Read<signed_char> local_4d0;
  LOs local_4c0;
  element_type *local_4b0;
  element_type *local_4a8;
  Write<double> local_4a0;
  Read<signed_char> local_490;
  undefined1 local_480 [32];
  undefined1 local_460 [16];
  LOs local_450;
  Read<signed_char> local_440;
  pointer local_430;
  pointer local_428;
  Read<signed_char> local_420;
  element_type *local_410;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_408;
  element_type *local_400;
  element_type *local_3f8;
  Write<signed_char> local_3f0;
  Read<signed_char> local_3e0;
  element_type *local_3d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c8;
  element_type *local_3c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b8;
  element_type *local_3b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a8;
  element_type *local_3a0;
  uint local_394;
  Alloc *local_390;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_388;
  Alloc *local_380;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_378;
  element_type *local_370;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  Alloc *local_360 [2];
  element_type *local_350;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_348;
  element_type *local_340;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_338;
  element_type *local_330;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_328;
  element_type *local_320;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_318;
  element_type *local_310;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_308;
  LOs local_300;
  Read<signed_char> local_2f0;
  LOs local_2e0;
  Write<signed_char> local_2d0;
  LOs local_2c0;
  element_type local_2b0;
  Read<signed_char> local_280;
  Reals local_270;
  Reals local_260;
  Read<signed_char> local_250;
  LOs local_240;
  Read<double> local_230;
  Read<double> local_220;
  Read<signed_char> local_210;
  LOs local_200;
  Read<signed_char> local_1f0;
  LOs local_1e0;
  Read<double> local_1d0;
  Read<double> local_1c0;
  Alloc *local_1b0 [2];
  Cavs local_1a0;
  Read<double> local_160;
  Write<double> local_150;
  Write<signed_char> local_140;
  Read<signed_char> local_130;
  Alloc *local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  Alloc *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  Read<signed_char> local_100;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  element_type *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 local_c0 [16];
  Alloc *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  Alloc *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  Cavs local_90;
  Write<signed_char> local_50;
  Alloc *local_40 [2];
  
  local_428 = (pointer)new_elem_densities;
  local_318._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cavs;
  local_308._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)old_elem_densities;
  begin_code("transfer_integ_error",(char *)0x0);
  uVar5 = old_mesh->dim_;
  if (3 < uVar5) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  pTVar14 = Mesh::get_tag<double>(old_mesh,uVar5,error_name);
  local_5c4 = TagBase::ncomps(&pTVar14->super_TagBase);
  Tag<double>::array(pTVar14);
  LVar13 = Mesh::nelems(new_mesh);
  local_570._0_8_ = (Alloc *)(local_570 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"");
  Write<double>::Write(&local_4a0,LVar13 * local_5c4,0.0,(string *)local_570);
  if ((Alloc *)local_570._0_8_ != (Alloc *)(local_570 + 0x10)) {
    operator_delete((void *)local_570._0_8_,(ulong)(local_570._16_8_ + 1));
  }
  local_2e0.write_.shared_alloc_.alloc = (same_ents2old_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_2e0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2e0.write_.shared_alloc_.alloc =
           (Alloc *)((local_2e0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_2e0.write_.shared_alloc_.alloc)->use_count =
           (local_2e0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2e0.write_.shared_alloc_.direct_ptr = (same_ents2old_ents->write_).shared_alloc_.direct_ptr;
  local_130.write_.shared_alloc_.alloc = local_110;
  if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_130.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
    }
    else {
      local_110->use_count = local_110->use_count + 1;
    }
  }
  local_130.write_.shared_alloc_.direct_ptr = local_108._M_pi;
  unmap<double>((Omega_h *)&local_50,&local_2e0,&local_130,local_5c4);
  read<double>((Omega_h *)&local_120,&local_50);
  if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 && local_50.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar3 = &(local_50.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_50.shared_alloc_.alloc);
      operator_delete(local_50.shared_alloc_.alloc,0x48);
    }
  }
  pAVar11 = local_130.write_.shared_alloc_.alloc;
  if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
      local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_130.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_130.write_.shared_alloc_.alloc);
      operator_delete(pAVar11,0x48);
    }
  }
  pAVar11 = local_2e0.write_.shared_alloc_.alloc;
  if (((ulong)local_2e0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_2e0.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_2e0.write_.shared_alloc_.alloc);
      operator_delete(pAVar11,0x48);
    }
  }
  local_2f0.write_.shared_alloc_.alloc = local_120;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2f0.write_.shared_alloc_.alloc = (Alloc *)(local_120->size * 8 + 1);
    }
    else {
      local_120->use_count = local_120->use_count + 1;
    }
  }
  local_2f0.write_.shared_alloc_.direct_ptr = local_118._M_pi;
  local_300.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_300.write_.shared_alloc_.alloc & 7) == 0 &&
      local_300.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_300.write_.shared_alloc_.alloc =
           (Alloc *)((local_300.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_300.write_.shared_alloc_.alloc)->use_count =
           (local_300.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_300.write_.shared_alloc_.direct_ptr = (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
  local_140.shared_alloc_.alloc = local_4a0.shared_alloc_.alloc;
  if (((ulong)local_4a0.shared_alloc_.alloc & 7) == 0 &&
      local_4a0.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_140.shared_alloc_.alloc = (Alloc *)((local_4a0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_4a0.shared_alloc_.alloc)->use_count = (local_4a0.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_140.shared_alloc_.direct_ptr = local_4a0.shared_alloc_.direct_ptr;
  map_into<double>(&local_2f0,&local_300,&local_140,local_5c4);
  pAVar11 = local_140.shared_alloc_.alloc;
  if (((ulong)local_140.shared_alloc_.alloc & 7) == 0 &&
      local_140.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_140.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_140.shared_alloc_.alloc);
      operator_delete(pAVar11,0x48);
    }
  }
  pAVar11 = local_300.write_.shared_alloc_.alloc;
  if (((ulong)local_300.write_.shared_alloc_.alloc & 7) == 0 &&
      local_300.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_300.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_300.write_.shared_alloc_.alloc);
      operator_delete(pAVar11,0x48);
    }
  }
  pAVar11 = local_2f0.write_.shared_alloc_.alloc;
  local_394 = uVar5;
  local_310 = (element_type *)error_name;
  if (((ulong)local_2f0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_2f0.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_2f0.write_.shared_alloc_.alloc);
      operator_delete(pAVar11,0x48);
    }
  }
  psVar15 = (pointer)0x0;
  local_328._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460;
  local_340 = &local_530;
  local_320 = (element_type *)local_c0;
  local_330 = (element_type *)local_e0;
  local_338._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0;
  local_348._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_2b0.super_Graph.ab2b;
  local_350 = &local_2b0;
  do {
    local_430 = psVar15;
    if (conserved_bools.this_time._M_elems
        [(long)&(psVar15->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr] == false) {
      peVar17 = *(element_type **)((long)local_318._M_pi + (long)psVar15 * 0x48 + 0x18);
      local_3d0 = *(element_type **)((long)local_318._M_pi + (long)psVar15 * 0x48 + 0x20);
      if (peVar17 != local_3d0) {
        do {
          local_570._0_8_ = (peVar17->super_Graph).a2ab.write_.shared_alloc_.alloc;
          if ((local_570._0_8_ & 7) == 0 && (Alloc *)local_570._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_570._0_8_ = ((Alloc *)local_570._0_8_)->size * 8 + 1;
            }
            else {
              ((Alloc *)local_570._0_8_)->use_count = ((Alloc *)local_570._0_8_)->use_count + 1;
            }
          }
          local_570._8_8_ = (peVar17->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
          local_570._16_8_ = (peVar17->super_Graph).ab2b.write_.shared_alloc_.alloc;
          if ((local_570._16_8_ & 7) == 0 && (Alloc *)local_570._16_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_570._16_8_ = ((Alloc *)local_570._16_8_)->size * 8 + 1;
            }
            else {
              ((Alloc *)local_570._16_8_)->use_count = ((Alloc *)local_570._16_8_)->use_count + 1;
            }
          }
          local_570._24_8_ = (peVar17->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
          local_550 = (element_type *)(peVar17->codes).write_.shared_alloc_.alloc;
          if (((ulong)local_550 & 7) == 0 && local_550 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_550 = (element_type *)
                          ((long)(local_550->parent_comm_).
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_550->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_550->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_548 = (element_type *)(peVar17->codes).write_.shared_alloc_.direct_ptr;
          local_540 = (element_type *)peVar17[1].super_Graph.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_540 & 7) == 0 && local_540 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_540 = (element_type *)
                          ((long)(local_540->parent_comm_).
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_540->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_540->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_538 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      peVar17[1].super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
          local_1a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc = (Alloc *)local_570._0_8_;
          if ((local_570._0_8_ & 7) == 0 && (Alloc *)local_570._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_1a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)(*(long *)local_570._0_8_ * 8 + 1);
            }
            else {
              *(int *)(local_570._0_8_ + 0x30) = *(int *)(local_570._0_8_ + 0x30) + 1;
            }
          }
          local_1a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_570._16_8_;
          if ((local_570._16_8_ & 7) == 0 && (Alloc *)local_570._16_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_1a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)(*(long *)local_570._16_8_ * 8 + 1);
            }
            else {
              *(int *)(local_570._16_8_ + 0x30) = *(int *)(local_570._16_8_ + 0x30) + 1;
            }
          }
          local_1a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc = (Alloc *)local_550;
          if (((ulong)local_550 & 7) == 0 && local_550 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_1a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_550->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_550->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_550->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_1a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_540;
          if (((ulong)local_540 & 7) == 0 && local_540 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_1a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_540->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_540->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_540->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_3c8._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (((Write<double> *)&(local_308._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).alloc;
          if (((ulong)local_3c8._M_pi & 7) == 0 && (Alloc *)local_3c8._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_3c8._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (((Alloc *)local_3c8._M_pi)->size * 8 + 1);
            }
            else {
              ((Alloc *)local_3c8._M_pi)->use_count = ((Alloc *)local_3c8._M_pi)->use_count + 1;
            }
          }
          local_3c0 = *(element_type **)&(local_308._M_pi)->_M_use_count;
          local_370 = (element_type *)
                      ((SharedAlloc *)
                      &(local_428->
                       super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->alloc;
          if (((ulong)local_370 & 7) == 0 && local_370 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_370 = (element_type *)
                          ((long)(local_370->parent_comm_).
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_370->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_370->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_368._M_pi =
               (local_428->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          local_380 = local_4a0.shared_alloc_.alloc;
          if (((ulong)local_4a0.shared_alloc_.alloc & 7) == 0 &&
              local_4a0.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_380 = (Alloc *)((local_4a0.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_4a0.shared_alloc_.alloc)->use_count =
                   (local_4a0.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_378._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a0.shared_alloc_.direct_ptr;
          if (((ulong)local_3c8._M_pi & 1) == 0) {
            pp_Var16 = (local_3c8._M_pi)->_vptr__Sp_counted_base;
          }
          else {
            pp_Var16 = (_func_int **)((ulong)local_3c8._M_pi >> 3);
          }
          local_1a0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr = (void *)local_570._8_8_;
          local_1a0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr = (void *)local_570._24_8_;
          local_1a0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr = local_548;
          local_1a0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr = local_538;
          LVar13 = Mesh::nelems(old_mesh);
          width = divide_no_remainder<int>((int)((ulong)pp_Var16 >> 3),LVar13);
          local_5c0 = (element_type *)local_1a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_1a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_1a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_5c0 = (element_type *)
                          ((long)(((CommPtr *)
                                  &(local_1a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size)
                                 ->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_1a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_1a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          local_5b8 = (element_type *)local_1a0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr;
          local_5b0 = (element_type *)local_1a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_1a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_1a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_5b0 = (element_type *)
                          ((long)(((CommPtr *)
                                  &(local_1a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size)
                                 ->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_1a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_1a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          local_5a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_1a0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr;
          local_5a0 = (element_type *)local_1a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_1a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_1a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_5a0 = (element_type *)
                          ((long)(((CommPtr *)
                                  &(local_1a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size)
                                 ->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_1a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_1a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          local_598 = (element_type *)local_1a0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr;
          local_590 = (element_type *)local_1a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_1a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_1a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_590 = (element_type *)
                          ((long)(((CommPtr *)
                                  &(local_1a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size)
                                 ->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_1a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_1a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          local_588 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_1a0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr;
          Mesh::ask_sizes((Mesh *)local_480);
          Mesh::ask_sizes((Mesh *)&local_400);
          local_4c0.write_.shared_alloc_.alloc = (Alloc *)local_590;
          if (((ulong)local_590 & 7) == 0 && local_590 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_4c0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_590->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_590->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_590->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_4c0.write_.shared_alloc_.direct_ptr = local_588;
          local_4d0.write_.shared_alloc_.alloc = (Alloc *)local_3c8._M_pi;
          if (((ulong)local_3c8._M_pi & 7) == 0 && (Alloc *)local_3c8._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_4d0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_3c8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&local_3c8._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&local_3c8._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_4d0.write_.shared_alloc_.direct_ptr = local_3c0;
          unmap<double>((Omega_h *)local_360,&local_4c0,&local_4d0,width);
          read<double>((Omega_h *)&local_4b0,(Write<signed_char> *)local_360);
          pAVar11 = local_360[0];
          if (((ulong)local_360[0] & 7) == 0 && local_360[0] != (Alloc *)0x0) {
            piVar3 = &local_360[0]->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_360[0]);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_4d0.write_.shared_alloc_.alloc;
          if (((ulong)local_4d0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_4d0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_4d0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_4d0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_4c0.write_.shared_alloc_.alloc;
          if (((ulong)local_4c0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_4c0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_4c0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_4c0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_4e0.write_.shared_alloc_.alloc = (Alloc *)local_5b0;
          if (((ulong)local_5b0 & 7) == 0 && local_5b0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_4e0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_5b0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_5b0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_5b0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_4e0.write_.shared_alloc_.direct_ptr = local_5a8;
          local_440.write_.shared_alloc_.alloc = (Alloc *)local_370;
          if (((ulong)local_370 & 7) == 0 && local_370 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_440.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_370->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_370->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_370->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_440.write_.shared_alloc_.direct_ptr = local_368._M_pi;
          unmap<double>((Omega_h *)&local_3a8,&local_4e0,&local_440,width);
          read<double>((Omega_h *)&local_410,(Write<signed_char> *)&local_3a8);
          _Var12._M_pi = local_3a8._M_pi;
          if (((ulong)local_3a8._M_pi & 7) == 0 && (Alloc *)local_3a8._M_pi != (Alloc *)0x0) {
            p_Var1 = local_3a8._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_3a8._M_pi);
              operator_delete(_Var12._M_pi,0x48);
            }
          }
          pAVar11 = local_440.write_.shared_alloc_.alloc;
          if (((ulong)local_440.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_440.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_440.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_440.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_4e0.write_.shared_alloc_.alloc;
          if (((ulong)local_4e0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_4e0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_4e0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_4e0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_460._0_8_ = local_590;
          if (((ulong)local_590 & 7) == 0 && local_590 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_460._0_8_ =
                   (long)(local_590->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                   1;
            }
            else {
              *(int *)&local_590->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_590->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_460._8_8_ = local_588;
          local_4f0.write_.shared_alloc_.alloc = (Alloc *)local_480._0_8_;
          if ((local_480._0_8_ & 7) == 0 && (element_type *)local_480._0_8_ != (element_type *)0x0)
          {
            if (entering_parallel == '\x01') {
              local_4f0.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_480._0_8_ * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)(local_480._0_8_ + 0x30))->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)(local_480._0_8_ + 0x30))->write_).shared_alloc_.alloc + 1;
            }
          }
          local_4f0.write_.shared_alloc_.direct_ptr = (void *)local_480._8_8_;
          unmap<double>((Omega_h *)&local_3e0,(LOs *)local_460,&local_4f0,1);
          read<double>((Omega_h *)&local_450,(Write<signed_char> *)&local_3e0);
          pAVar11 = local_3e0.write_.shared_alloc_.alloc;
          if (((ulong)local_3e0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_3e0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_3e0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_3e0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_4f0.write_.shared_alloc_.alloc;
          if (((ulong)local_4f0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_4f0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_4f0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_4f0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          uVar9 = local_460._0_8_;
          if ((local_460._0_8_ & 7) == 0 && (element_type *)local_460._0_8_ != (element_type *)0x0)
          {
            pLVar4 = (LOs *)(local_460._0_8_ + 0x30);
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_460._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          local_500.write_.shared_alloc_.alloc = (Alloc *)local_5b0;
          if (((ulong)local_5b0 & 7) == 0 && local_5b0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_500.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_5b0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_5b0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_5b0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_500.write_.shared_alloc_.direct_ptr = local_5a8;
          local_530.codes.write_.shared_alloc_.alloc = (Alloc *)local_400;
          if (((ulong)local_400 & 7) == 0 && local_400 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_530.codes.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_400->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_400->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_400->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_530.codes.write_.shared_alloc_.direct_ptr = local_3f8;
          unmap<double>((Omega_h *)&local_3b8,&local_500,&local_530.codes,1);
          read<double>((Omega_h *)&local_580,(Write<signed_char> *)&local_3b8);
          _Var12._M_pi = local_3b8._M_pi;
          if (((ulong)local_3b8._M_pi & 7) == 0 && (Alloc *)local_3b8._M_pi != (Alloc *)0x0) {
            p_Var1 = local_3b8._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_3b8._M_pi);
              operator_delete(_Var12._M_pi,0x48);
            }
          }
          pAVar11 = local_530.codes.write_.shared_alloc_.alloc;
          if (((ulong)local_530.codes.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_530.codes.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_530.codes.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_530.codes.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_500.write_.shared_alloc_.alloc;
          if (((ulong)local_500.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_500.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_500.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_500.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_530.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_4b0;
          if (((ulong)local_4b0 & 7) == 0 && local_4b0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_530.super_Graph.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_4b0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_530.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = local_4a8;
          local_530.super_Graph.a2ab.write_.shared_alloc_.alloc =
               local_450.write_.shared_alloc_.alloc;
          if (((ulong)local_450.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_450.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_530.super_Graph.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)&(local_450.write_.shared_alloc_.alloc)->size)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_450.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_450.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_530.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
               local_450.write_.shared_alloc_.direct_ptr;
          local_5e8._0_8_ = local_5e8 + 0x10;
          local_5e8._8_8_ = (void *)0x0;
          local_5e8._16_8_ = local_5e8._16_8_ & 0xffffffffffffff00;
          multiply_each<double>
                    ((Omega_h *)local_1b0,(Read<double> *)&local_530.super_Graph.ab2b,
                     (Read<double> *)&local_530,(string *)local_5e8);
          Read<double>::Read(&local_420,(Write<double> *)local_1b0);
          pAVar11 = local_1b0[0];
          if (((ulong)local_1b0[0] & 7) == 0 && local_1b0[0] != (Alloc *)0x0) {
            piVar3 = &local_1b0[0]->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_1b0[0]);
              operator_delete(pAVar11,0x48);
            }
          }
          if ((Alloc *)local_5e8._0_8_ != (Alloc *)(local_5e8 + 0x10)) {
            operator_delete((void *)local_5e8._0_8_,local_5e8._16_8_ + 1);
          }
          pAVar11 = local_530.super_Graph.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_530.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_530.super_Graph.a2ab.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_530.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_530.super_Graph.a2ab.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_530.super_Graph.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_530.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_530.super_Graph.ab2b.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_530.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_530.super_Graph.ab2b.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_1c0.write_.shared_alloc_.alloc = (Alloc *)local_410;
          if (((ulong)local_410 & 7) == 0 && local_410 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_1c0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_410->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_410->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_410->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_1c0.write_.shared_alloc_.direct_ptr = local_408;
          local_1d0.write_.shared_alloc_.alloc = local_580.write_.shared_alloc_.alloc;
          if (((ulong)local_580.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_580.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_1d0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)&(local_580.write_.shared_alloc_.alloc)->size)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_580.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_580.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_1d0.write_.shared_alloc_.direct_ptr = local_580.write_.shared_alloc_.direct_ptr;
          local_5e8._0_8_ = local_5e8 + 0x10;
          local_5e8._8_8_ = (void *)0x0;
          local_5e8._16_8_ = local_5e8._16_8_ & 0xffffffffffffff00;
          multiply_each<double>((Omega_h *)&local_3f0,&local_1c0,&local_1d0,(string *)local_5e8);
          Read<double>::Read(&local_490,(Write<double> *)&local_3f0);
          pAVar11 = local_3f0.shared_alloc_.alloc;
          if (((ulong)local_3f0.shared_alloc_.alloc & 7) == 0 &&
              local_3f0.shared_alloc_.alloc != (Alloc *)0x0) {
            p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_3f0.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(local_3f0.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          if ((Alloc *)local_5e8._0_8_ != (Alloc *)(local_5e8 + 0x10)) {
            operator_delete((void *)local_5e8._0_8_,local_5e8._16_8_ + 1);
          }
          pAVar11 = local_1d0.write_.shared_alloc_.alloc;
          if (((ulong)local_1d0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_1d0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_1d0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_1d0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_1c0.write_.shared_alloc_.alloc;
          if (((ulong)local_1c0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_1c0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_1c0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_1c0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_1e0.write_.shared_alloc_.alloc = (Alloc *)local_5a0;
          if (((ulong)local_5a0 & 7) == 0 && local_5a0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_1e0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_5a0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_5a0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_5a0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_1e0.write_.shared_alloc_.direct_ptr = local_598;
          local_1f0.write_.shared_alloc_.alloc = local_420.write_.shared_alloc_.alloc;
          if (((ulong)local_420.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_420.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_1f0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)&(local_420.write_.shared_alloc_.alloc)->size)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_420.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_420.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_1f0.write_.shared_alloc_.direct_ptr = local_420.write_.shared_alloc_.direct_ptr;
          fan_reduce<double>((Omega_h *)&local_a0,&local_1e0,&local_1f0,width,OMEGA_H_SUM);
          pAVar11 = local_1f0.write_.shared_alloc_.alloc;
          if (((ulong)local_1f0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_1f0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_1f0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_1f0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_1e0.write_.shared_alloc_.alloc;
          if (((ulong)local_1e0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_1e0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_1e0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_1e0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_200.write_.shared_alloc_.alloc = (Alloc *)local_5c0;
          if (((ulong)local_5c0 & 7) == 0 && local_5c0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_200.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_5c0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_5c0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_5c0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_200.write_.shared_alloc_.direct_ptr = local_5b8;
          local_210.write_.shared_alloc_.alloc = local_490.write_.shared_alloc_.alloc;
          if (((ulong)local_490.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_490.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_210.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)&(local_490.write_.shared_alloc_.alloc)->size)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_490.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_490.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_210.write_.shared_alloc_.direct_ptr = local_490.write_.shared_alloc_.direct_ptr;
          fan_reduce<double>((Omega_h *)&local_b0,&local_200,&local_210,width,OMEGA_H_SUM);
          pAVar11 = local_210.write_.shared_alloc_.alloc;
          if (((ulong)local_210.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_210.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_210.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_210.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_200.write_.shared_alloc_.alloc;
          if (((ulong)local_200.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_200.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_200.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_200.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_220.write_.shared_alloc_.alloc = local_b0;
          if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_220.write_.shared_alloc_.alloc = (Alloc *)(local_b0->size * 8 + 1);
            }
            else {
              local_b0->use_count = local_b0->use_count + 1;
            }
          }
          local_220.write_.shared_alloc_.direct_ptr = local_a8._M_pi;
          local_230.write_.shared_alloc_.alloc = local_a0;
          if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_230.write_.shared_alloc_.alloc = (Alloc *)(local_a0->size * 8 + 1);
            }
            else {
              local_a0->use_count = local_a0->use_count + 1;
            }
          }
          local_230.write_.shared_alloc_.direct_ptr = local_98._M_pi;
          subtract_each<double>((Omega_h *)local_c0,&local_220,&local_230);
          pAVar11 = local_230.write_.shared_alloc_.alloc;
          if (((ulong)local_230.write_.shared_alloc_.alloc & 7) == 0 &&
              local_230.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_230.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_230.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_220.write_.shared_alloc_.alloc;
          if (((ulong)local_220.write_.shared_alloc_.alloc & 7) == 0 &&
              local_220.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_220.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_220.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_240.write_.shared_alloc_.alloc = (Alloc *)local_5c0;
          if (((ulong)local_5c0 & 7) == 0 && local_5c0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_240.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_5c0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_5c0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_5c0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_240.write_.shared_alloc_.direct_ptr = local_5b8;
          local_250.write_.shared_alloc_.alloc = local_580.write_.shared_alloc_.alloc;
          if (((ulong)local_580.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_580.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_250.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)&(local_580.write_.shared_alloc_.alloc)->size)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_580.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_580.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_250.write_.shared_alloc_.direct_ptr = local_580.write_.shared_alloc_.direct_ptr;
          fan_reduce<double>((Omega_h *)&local_d0,&local_240,&local_250,1,OMEGA_H_SUM);
          pAVar11 = local_250.write_.shared_alloc_.alloc;
          if (((ulong)local_250.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_250.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_250.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_250.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_240.write_.shared_alloc_.alloc;
          if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_240.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_240.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_240.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_260.write_.shared_alloc_.alloc = (Alloc *)local_c0._0_8_;
          if ((local_c0._0_8_ & 7) == 0 && (element_type *)local_c0._0_8_ != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_260.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)local_c0._0_8_)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)(local_c0._0_8_ + 0x30))->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)(local_c0._0_8_ + 0x30))->write_).shared_alloc_.alloc + 1;
            }
          }
          local_260.write_.shared_alloc_.direct_ptr = (void *)local_c0._8_8_;
          local_270.write_.shared_alloc_.alloc = (Alloc *)local_d0;
          if (((ulong)local_d0 & 7) == 0 && local_d0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_270.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_d0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_d0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_d0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_270.write_.shared_alloc_.direct_ptr = local_c8._M_pi;
          divide_each_maybe_zero((Omega_h *)local_e0,&local_260,&local_270);
          pAVar11 = local_270.write_.shared_alloc_.alloc;
          if (((ulong)local_270.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_270.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_270.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_270.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_260.write_.shared_alloc_.alloc;
          if (((ulong)local_260.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_260.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_260.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_260.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_280.write_.shared_alloc_.alloc = (Alloc *)local_e0._0_8_;
          if ((local_e0._0_8_ & 7) == 0 && (Library *)local_e0._0_8_ != (Library *)0x0) {
            if (entering_parallel == '\x01') {
              local_280.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_e0._0_8_ * 8 + 1);
            }
            else {
              *(int *)&(((CommPtr *)(local_e0._0_8_ + 0x30))->
                       super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   *(int *)&(((CommPtr *)(local_e0._0_8_ + 0x30))->
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                   1;
            }
          }
          local_280.write_.shared_alloc_.direct_ptr = (void *)local_e0._8_8_;
          local_2b0.codes.write_.shared_alloc_.alloc = (Alloc *)local_5c0;
          if (((ulong)local_5c0 & 7) == 0 && local_5c0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_2b0.codes.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_5c0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_5c0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_5c0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_2b0.codes.write_.shared_alloc_.direct_ptr = local_5b8;
          expand<double>((Omega_h *)local_f0,&local_280,(LOs *)&local_2b0.codes,width);
          pAVar11 = local_2b0.codes.write_.shared_alloc_.alloc;
          if (((ulong)local_2b0.codes.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_2b0.codes.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_2b0.codes.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_2b0.codes.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_280.write_.shared_alloc_.alloc;
          if (((ulong)local_280.write_.shared_alloc_.alloc & 7) == 0 &&
              (Library *)local_280.write_.shared_alloc_.alloc != (Library *)0x0) {
            pCVar2 = (CommPtr *)&(local_280.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 = *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + -1;
            if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr == 0) {
              Alloc::~Alloc(local_280.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_2b0.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_f0._0_8_;
          if ((local_f0._0_8_ & 7) == 0 && (Alloc *)local_f0._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_2b0.super_Graph.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)(*(size_t *)local_f0._0_8_ * 8 + 1);
            }
            else {
              *(int *)(local_f0._0_8_ + 0x30) = *(int *)(local_f0._0_8_ + 0x30) + 1;
            }
          }
          local_2b0.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (void *)local_f0._8_8_;
          local_2b0.super_Graph.a2ab.write_.shared_alloc_.alloc =
               local_580.write_.shared_alloc_.alloc;
          if (((ulong)local_580.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_580.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_2b0.super_Graph.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)&(local_580.write_.shared_alloc_.alloc)->size)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_580.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_580.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_2b0.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
               local_580.write_.shared_alloc_.direct_ptr;
          local_5e8._0_8_ = local_5e8 + 0x10;
          local_5e8._8_8_ = (void *)0x0;
          local_5e8._16_8_ = local_5e8._16_8_ & 0xffffffffffffff00;
          multiply_each<double>
                    ((Omega_h *)local_40,(Read<double> *)&local_2b0.super_Graph.ab2b,
                     (Read<double> *)&local_2b0,(string *)local_5e8);
          Read<double>::Read(&local_100,(Write<double> *)local_40);
          pAVar11 = local_40[0];
          if (((ulong)local_40[0] & 7) == 0 && local_40[0] != (Alloc *)0x0) {
            piVar3 = &local_40[0]->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_40[0]);
              operator_delete(pAVar11,0x48);
            }
          }
          if ((Alloc *)local_5e8._0_8_ != (Alloc *)(local_5e8 + 0x10)) {
            operator_delete((void *)local_5e8._0_8_,(ulong)(local_5e8._16_8_ + 1));
          }
          pAVar11 = local_2b0.super_Graph.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_2b0.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_2b0.super_Graph.a2ab.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_2b0.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_2b0.super_Graph.a2ab.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_2b0.super_Graph.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_2b0.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_2b0.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_2b0.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_2b0.super_Graph.ab2b.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_5e8._0_8_ = local_100.write_.shared_alloc_.alloc;
          if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
              local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_5e8._0_8_ = (local_100.write_.shared_alloc_.alloc)->size * 8 + 1;
            }
            else {
              (local_100.write_.shared_alloc_.alloc)->use_count =
                   (local_100.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_5e8._8_8_ = local_100.write_.shared_alloc_.direct_ptr;
          local_2c0.write_.shared_alloc_.alloc = (Alloc *)local_5b0;
          if (((ulong)local_5b0 & 7) == 0 && local_5b0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_2c0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_5b0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_5b0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_5b0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_2c0.write_.shared_alloc_.direct_ptr = local_5a8;
          local_2d0.shared_alloc_.alloc = local_380;
          if (((ulong)local_380 & 7) == 0 && local_380 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_2d0.shared_alloc_.alloc = (Alloc *)(local_380->size * 8 + 1);
            }
            else {
              local_380->use_count = local_380->use_count + 1;
            }
          }
          local_2d0.shared_alloc_.direct_ptr = local_378._M_pi;
          add_into<double>((Read<signed_char> *)local_5e8,&local_2c0,&local_2d0,width);
          pAVar11 = local_2d0.shared_alloc_.alloc;
          if (((ulong)local_2d0.shared_alloc_.alloc & 7) == 0 &&
              local_2d0.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_2d0.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_2d0.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_2c0.write_.shared_alloc_.alloc;
          if (((ulong)local_2c0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_2c0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_2c0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_2c0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          uVar9 = local_5e8._0_8_;
          if ((local_5e8._0_8_ & 7) == 0 && (Alloc *)local_5e8._0_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_5e8._0_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_5e8._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          pAVar11 = local_100.write_.shared_alloc_.alloc;
          if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
              local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar3 = &(local_100.write_.shared_alloc_.alloc)->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_100.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          uVar9 = local_f0._0_8_;
          if ((local_f0._0_8_ & 7) == 0 && (Alloc *)local_f0._0_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_f0._0_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_f0._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          uVar9 = local_e0._0_8_;
          if ((local_e0._0_8_ & 7) == 0 && (Library *)local_e0._0_8_ != (Library *)0x0) {
            pCVar2 = (CommPtr *)(local_e0._0_8_ + 0x30);
            *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 = *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + -1;
            if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr == 0) {
              Alloc::~Alloc((Alloc *)local_e0._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          peVar10 = local_d0;
          if (((ulong)local_d0 & 7) == 0 && local_d0 != (element_type *)0x0) {
            pLVar4 = local_d0->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_d0);
              operator_delete(peVar10,0x48);
            }
          }
          uVar9 = local_c0._0_8_;
          if ((local_c0._0_8_ & 7) == 0 && (element_type *)local_c0._0_8_ != (element_type *)0x0) {
            pLVar4 = (LOs *)(local_c0._0_8_ + 0x30);
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_c0._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          pAVar11 = local_b0;
          if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
            piVar3 = &local_b0->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_b0);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_a0;
          if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
            piVar3 = &local_a0->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_a0);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_490.write_.shared_alloc_.alloc;
          if (((ulong)local_490.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_490.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_490.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_490.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_420.write_.shared_alloc_.alloc;
          if (((ulong)local_420.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_420.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_420.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_420.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_580.write_.shared_alloc_.alloc;
          if (((ulong)local_580.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_580.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_580.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_580.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_450.write_.shared_alloc_.alloc;
          if (((ulong)local_450.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_450.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_450.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_450.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          peVar10 = local_410;
          if (((ulong)local_410 & 7) == 0 && local_410 != (element_type *)0x0) {
            pLVar4 = local_410->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_410);
              operator_delete(peVar10,0x48);
            }
          }
          peVar10 = local_4b0;
          if (((ulong)local_4b0 & 7) == 0 && local_4b0 != (element_type *)0x0) {
            pLVar4 = local_4b0->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_4b0);
              operator_delete(peVar10,0x48);
            }
          }
          peVar10 = local_400;
          if (((ulong)local_400 & 7) == 0 && local_400 != (element_type *)0x0) {
            pLVar4 = local_400->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_400);
              operator_delete(peVar10,0x48);
            }
          }
          uVar9 = local_480._0_8_;
          if ((local_480._0_8_ & 7) == 0 && (element_type *)local_480._0_8_ != (element_type *)0x0)
          {
            pLVar4 = (LOs *)(local_480._0_8_ + 0x30);
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_480._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          peVar10 = local_590;
          if (((ulong)local_590 & 7) == 0 && local_590 != (element_type *)0x0) {
            pLVar4 = local_590->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_590);
              operator_delete(peVar10,0x48);
            }
          }
          peVar10 = local_5a0;
          if (((ulong)local_5a0 & 7) == 0 && local_5a0 != (element_type *)0x0) {
            pLVar4 = local_5a0->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_5a0);
              operator_delete(peVar10,0x48);
            }
          }
          peVar10 = local_5b0;
          if (((ulong)local_5b0 & 7) == 0 && local_5b0 != (element_type *)0x0) {
            pLVar4 = local_5b0->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_5b0);
              operator_delete(peVar10,0x48);
            }
          }
          peVar10 = local_5c0;
          if (((ulong)local_5c0 & 7) == 0 && local_5c0 != (element_type *)0x0) {
            pLVar4 = local_5c0->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_5c0);
              operator_delete(peVar10,0x48);
            }
          }
          pAVar11 = local_380;
          if (((ulong)local_380 & 7) == 0 && local_380 != (Alloc *)0x0) {
            piVar3 = &local_380->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_380);
              operator_delete(pAVar11,0x48);
            }
          }
          peVar10 = local_370;
          if (((ulong)local_370 & 7) == 0 && local_370 != (element_type *)0x0) {
            pLVar4 = local_370->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_370);
              operator_delete(peVar10,0x48);
            }
          }
          _Var12._M_pi = local_3c8._M_pi;
          if (((ulong)local_3c8._M_pi & 7) == 0 && (Alloc *)local_3c8._M_pi != (Alloc *)0x0) {
            p_Var1 = local_3c8._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_3c8._M_pi);
              operator_delete(_Var12._M_pi,0x48);
            }
          }
          Cavs::~Cavs(&local_1a0);
          Cavs::~Cavs((Cavs *)local_570);
          peVar17 = (element_type *)&peVar17[1].super_Graph.ab2b;
        } while (peVar17 != local_3d0);
      }
    }
    if (conserved_bools.always._M_elems
        [(long)&(local_430->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr] == false) {
      peVar17 = *(element_type **)((long)local_318._M_pi + (long)local_430 * 0x48 + 0x18);
      local_3d0 = *(element_type **)((long)local_318._M_pi + (long)local_430 * 0x48 + 0x20);
      if (peVar17 != local_3d0) {
        do {
          local_570._0_8_ = (peVar17->super_Graph).a2ab.write_.shared_alloc_.alloc;
          if ((local_570._0_8_ & 7) == 0 && (Alloc *)local_570._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_570._0_8_ = ((Alloc *)local_570._0_8_)->size * 8 + 1;
            }
            else {
              ((Alloc *)local_570._0_8_)->use_count = ((Alloc *)local_570._0_8_)->use_count + 1;
            }
          }
          local_570._8_8_ = (peVar17->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
          local_570._16_8_ = (peVar17->super_Graph).ab2b.write_.shared_alloc_.alloc;
          if ((local_570._16_8_ & 7) == 0 && (Alloc *)local_570._16_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_570._16_8_ = ((Alloc *)local_570._16_8_)->size * 8 + 1;
            }
            else {
              ((Alloc *)local_570._16_8_)->use_count = ((Alloc *)local_570._16_8_)->use_count + 1;
            }
          }
          local_570._24_8_ = (peVar17->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
          local_550 = (element_type *)(peVar17->codes).write_.shared_alloc_.alloc;
          if (((ulong)local_550 & 7) == 0 && local_550 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_550 = (element_type *)
                          ((long)(local_550->parent_comm_).
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_550->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_550->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_548 = (element_type *)(peVar17->codes).write_.shared_alloc_.direct_ptr;
          local_540 = (element_type *)peVar17[1].super_Graph.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_540 & 7) == 0 && local_540 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_540 = (element_type *)
                          ((long)(local_540->parent_comm_).
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_540->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_540->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_538 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      peVar17[1].super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
          local_90.keys2old_elems.a2ab.write_.shared_alloc_.alloc = (Alloc *)local_570._0_8_;
          if ((local_570._0_8_ & 7) == 0 && (Alloc *)local_570._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_90.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)(*(long *)local_570._0_8_ * 8 + 1);
            }
            else {
              *(int *)(local_570._0_8_ + 0x30) = *(int *)(local_570._0_8_ + 0x30) + 1;
            }
          }
          local_90.keys2old_elems.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_570._16_8_;
          if ((local_570._16_8_ & 7) == 0 && (Alloc *)local_570._16_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_90.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)(*(long *)local_570._16_8_ * 8 + 1);
            }
            else {
              *(int *)(local_570._16_8_ + 0x30) = *(int *)(local_570._16_8_ + 0x30) + 1;
            }
          }
          local_90.keys2new_elems.a2ab.write_.shared_alloc_.alloc = (Alloc *)local_550;
          if (((ulong)local_550 & 7) == 0 && local_550 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_90.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_550->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_550->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_550->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_90.keys2new_elems.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_540;
          if (((ulong)local_540 & 7) == 0 && local_540 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_90.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_540->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_540->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_540->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_390 = local_4a0.shared_alloc_.alloc;
          if (((ulong)local_4a0.shared_alloc_.alloc & 7) == 0 &&
              local_4a0.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_390 = (Alloc *)((local_4a0.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_4a0.shared_alloc_.alloc)->use_count =
                   (local_4a0.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_388._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a0.shared_alloc_.direct_ptr;
          uVar5 = old_mesh->dim_;
          local_90.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr = (void *)local_570._8_8_;
          local_90.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr = (void *)local_570._24_8_;
          local_90.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr = local_548;
          local_90.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr = local_538;
          if (3 < uVar5) {
            fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                 ,0x33);
          }
          local_5c0 = (element_type *)local_90.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_90.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_90.keys2old_elems.a2ab.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_5c0 = (element_type *)
                          ((long)(((CommPtr *)
                                  &(local_90.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size)
                                 ->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_90.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_90.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          local_5b0 = (element_type *)local_90.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_90.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_90.keys2old_elems.ab2b.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_5b0 = (element_type *)
                          ((long)(((CommPtr *)
                                  &(local_90.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size)
                                 ->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_90.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_90.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          local_5a0 = (element_type *)local_90.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_90.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_90.keys2new_elems.a2ab.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_5a0 = (element_type *)
                          ((long)(((CommPtr *)
                                  &(local_90.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size)
                                 ->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_90.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_90.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          local_590 = (element_type *)local_90.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_90.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_90.keys2new_elems.ab2b.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_590 = (element_type *)
                          ((long)(((CommPtr *)
                                  &(local_90.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size)
                                 ->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_90.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->
                                 use_count)->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_90.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->
                                      use_count)->write_).shared_alloc_.alloc + 1;
            }
          }
          local_5b8 = (element_type *)local_570._8_8_;
          local_5a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_570._24_8_;
          local_598 = local_548;
          local_588 = local_538;
          Mesh::ask_sizes((Mesh *)&local_400);
          local_4c0.write_.shared_alloc_.alloc = (Alloc *)local_590;
          if (((ulong)local_590 & 7) == 0 && local_590 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_4c0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_590->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_590->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_590->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_4c0.write_.shared_alloc_.direct_ptr = local_588;
          local_4d0.write_.shared_alloc_.alloc = (Alloc *)local_400;
          if (((ulong)local_400 & 7) == 0 && local_400 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_4d0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_400->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_400->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_400->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_4d0.write_.shared_alloc_.direct_ptr = local_3f8;
          unmap<double>((Omega_h *)local_360,&local_4c0,&local_4d0,1);
          read<double>((Omega_h *)&local_4b0,(Write<signed_char> *)local_360);
          pAVar11 = local_360[0];
          if (((ulong)local_360[0] & 7) == 0 && local_360[0] != (Alloc *)0x0) {
            piVar3 = &local_360[0]->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_360[0]);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_4d0.write_.shared_alloc_.alloc;
          if (((ulong)local_4d0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_4d0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_4d0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_4d0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_4c0.write_.shared_alloc_.alloc;
          if (((ulong)local_4c0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_4c0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_4c0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_4c0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pTVar14 = Mesh::get_tag<double>(old_mesh,uVar5,(string *)local_310);
          width_00 = TagBase::ncomps(&pTVar14->super_TagBase);
          Tag<double>::array(pTVar14);
          local_5e8._0_8_ = local_5c0;
          if (((ulong)local_5c0 & 7) == 0 && local_5c0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_5e8._0_8_ =
                   (long)(local_5c0->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                   1;
            }
            else {
              *(int *)&local_5c0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_5c0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_5e8._8_8_ = local_5b8;
          local_5e8._16_8_ = local_5b0;
          if (((ulong)local_5b0 & 7) == 0 && local_5b0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_5e8._16_8_ =
                   (long)(local_5b0->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                   1;
            }
            else {
              *(int *)&local_5b0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_5b0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_5e8._24_8_ = local_5a8;
          local_4e0.write_.shared_alloc_.alloc = (Alloc *)local_410;
          if (((ulong)local_410 & 7) == 0 && local_410 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_4e0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_410->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_410->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_410->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_4e0.write_.shared_alloc_.direct_ptr = local_408;
          graph_reduce<double>
                    ((Omega_h *)&local_3a8,(Graph *)local_5e8,(Read<double> *)&local_4e0,width_00,
                     OMEGA_H_SUM);
          pAVar11 = local_4e0.write_.shared_alloc_.alloc;
          if (((ulong)local_4e0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_4e0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_4e0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_4e0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          uVar9 = local_5e8._16_8_;
          if ((local_5e8._16_8_ & 7) == 0 && (Alloc *)local_5e8._16_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_5e8._16_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_5e8._16_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          uVar9 = local_5e8._0_8_;
          if ((local_5e8._0_8_ & 7) == 0 && (Alloc *)local_5e8._0_8_ != (Alloc *)0x0) {
            piVar3 = (int *)(local_5e8._0_8_ + 0x30);
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc((Alloc *)local_5e8._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          local_450.write_.shared_alloc_.alloc = (Alloc *)local_5a0;
          if (((ulong)local_5a0 & 7) == 0 && local_5a0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_450.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_5a0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_5a0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_5a0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_450.write_.shared_alloc_.direct_ptr = local_598;
          local_3e0.write_.shared_alloc_.alloc = (Alloc *)local_4b0;
          if (((ulong)local_4b0 & 7) == 0 && local_4b0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_3e0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_4b0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_3e0.write_.shared_alloc_.direct_ptr = local_4a8;
          fan_reduce<double>((Omega_h *)&local_440,&local_450,&local_3e0,1,OMEGA_H_SUM);
          pAVar11 = local_3e0.write_.shared_alloc_.alloc;
          if (((ulong)local_3e0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_3e0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_3e0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_3e0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_450.write_.shared_alloc_.alloc;
          if (((ulong)local_450.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_450.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_450.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_450.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_4f0.write_.shared_alloc_.alloc = (Alloc *)local_3a8._M_pi;
          if (((ulong)local_3a8._M_pi & 7) == 0 && (Alloc *)local_3a8._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_4f0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_3a8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&local_3a8._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&local_3a8._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_4f0.write_.shared_alloc_.direct_ptr = local_3a0;
          local_580.write_.shared_alloc_.alloc = local_440.write_.shared_alloc_.alloc;
          if (((ulong)local_440.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_440.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_580.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)&(local_440.write_.shared_alloc_.alloc)->size)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_440.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_440.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_580.write_.shared_alloc_.direct_ptr = local_440.write_.shared_alloc_.direct_ptr;
          divide_each_maybe_zero((Omega_h *)local_460,(Reals *)&local_4f0,&local_580);
          pAVar11 = local_580.write_.shared_alloc_.alloc;
          if (((ulong)local_580.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_580.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_580.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_580.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_4f0.write_.shared_alloc_.alloc;
          if (((ulong)local_4f0.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_4f0.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_4f0.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_4f0.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_500.write_.shared_alloc_.alloc = (Alloc *)local_460._0_8_;
          if ((local_460._0_8_ & 7) == 0 && (element_type *)local_460._0_8_ != (element_type *)0x0)
          {
            if (entering_parallel == '\x01') {
              local_500.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)local_460._0_8_)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)(local_460._0_8_ + 0x30))->write_).shared_alloc_.alloc =
                   *(int *)&(((LOs *)(local_460._0_8_ + 0x30))->write_).shared_alloc_.alloc + 1;
            }
          }
          local_500.write_.shared_alloc_.direct_ptr = (void *)local_460._8_8_;
          local_530.codes.write_.shared_alloc_.alloc = (Alloc *)local_5a0;
          if (((ulong)local_5a0 & 7) == 0 && local_5a0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_530.codes.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_5a0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_5a0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_5a0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_530.codes.write_.shared_alloc_.direct_ptr = local_598;
          expand<double>((Omega_h *)&local_3b8,(Read<signed_char> *)&local_500,
                         (LOs *)&local_530.codes,width_00);
          pAVar11 = local_530.codes.write_.shared_alloc_.alloc;
          if (((ulong)local_530.codes.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_530.codes.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_530.codes.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_530.codes.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_500.write_.shared_alloc_.alloc;
          if (((ulong)local_500.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_500.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_500.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_500.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_530.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_3b8._M_pi;
          if (((ulong)local_3b8._M_pi & 7) == 0 && (Alloc *)local_3b8._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_530.super_Graph.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_3b8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&local_3b8._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&local_3b8._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_530.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = local_3b0;
          local_530.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)local_4b0;
          if (((ulong)local_4b0 & 7) == 0 && local_4b0 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_530.super_Graph.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_4b0->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_4b0->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_530.super_Graph.a2ab.write_.shared_alloc_.direct_ptr = local_4a8;
          local_480._0_8_ = local_480 + 0x10;
          local_480._8_8_ = (element_type *)0x0;
          local_480[0x10] = '\0';
          multiply_each<double>
                    ((Omega_h *)local_1b0,(Read<double> *)&local_530.super_Graph.ab2b,
                     (Read<double> *)&local_530,(string *)local_480);
          Read<double>::Read(&local_420,(Write<double> *)local_1b0);
          pAVar11 = local_1b0[0];
          if (((ulong)local_1b0[0] & 7) == 0 && local_1b0[0] != (Alloc *)0x0) {
            piVar3 = &local_1b0[0]->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_1b0[0]);
              operator_delete(pAVar11,0x48);
            }
          }
          if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
            operator_delete((void *)local_480._0_8_,CONCAT71(local_480._17_7_,local_480[0x10]) + 1);
          }
          pAVar11 = local_530.super_Graph.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_530.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_530.super_Graph.a2ab.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_530.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_530.super_Graph.a2ab.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_530.super_Graph.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_530.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_530.super_Graph.ab2b.write_.shared_alloc_.alloc !=
              (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_530.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_530.super_Graph.ab2b.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          local_480._0_8_ = local_420.write_.shared_alloc_.alloc;
          if (((ulong)local_420.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_420.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_480._0_8_ =
                   (long)(((CommPtr *)&(local_420.write_.shared_alloc_.alloc)->size)->
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr * 8 +
                   1;
            }
            else {
              *(int *)&(((LOs *)&(local_420.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_420.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_480._8_8_ = local_420.write_.shared_alloc_.direct_ptr;
          local_490.write_.shared_alloc_.alloc = (Alloc *)local_590;
          if (((ulong)local_590 & 7) == 0 && local_590 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_490.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_590->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_590->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_590->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_490.write_.shared_alloc_.direct_ptr = local_588;
          local_3f0.shared_alloc_.alloc = local_390;
          if (((ulong)local_390 & 7) == 0 && local_390 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_3f0.shared_alloc_.alloc = (Alloc *)(local_390->size * 8 + 1);
            }
            else {
              local_390->use_count = local_390->use_count + 1;
            }
          }
          local_3f0.shared_alloc_.direct_ptr = local_388._M_pi;
          add_into<double>((Read<signed_char> *)local_480,(LOs *)&local_490,&local_3f0,width_00);
          pAVar11 = local_3f0.shared_alloc_.alloc;
          if (((ulong)local_3f0.shared_alloc_.alloc & 7) == 0 &&
              local_3f0.shared_alloc_.alloc != (Alloc *)0x0) {
            p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_3f0.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(local_3f0.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          pAVar11 = local_490.write_.shared_alloc_.alloc;
          if (((ulong)local_490.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_490.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_490.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_490.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          uVar9 = local_480._0_8_;
          if ((local_480._0_8_ & 7) == 0 && (element_type *)local_480._0_8_ != (element_type *)0x0)
          {
            pLVar4 = (LOs *)(local_480._0_8_ + 0x30);
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_480._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          pAVar11 = local_420.write_.shared_alloc_.alloc;
          if (((ulong)local_420.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_420.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_420.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_420.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          _Var12._M_pi = local_3b8._M_pi;
          if (((ulong)local_3b8._M_pi & 7) == 0 && (Alloc *)local_3b8._M_pi != (Alloc *)0x0) {
            p_Var1 = local_3b8._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_3b8._M_pi);
              operator_delete(_Var12._M_pi,0x48);
            }
          }
          uVar9 = local_460._0_8_;
          if ((local_460._0_8_ & 7) == 0 && (element_type *)local_460._0_8_ != (element_type *)0x0)
          {
            pLVar4 = (LOs *)(local_460._0_8_ + 0x30);
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_460._0_8_);
              operator_delete((void *)uVar9,0x48);
            }
          }
          pAVar11 = local_440.write_.shared_alloc_.alloc;
          if (((ulong)local_440.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_440.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar4 = (LOs *)&(local_440.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_440.write_.shared_alloc_.alloc);
              operator_delete(pAVar11,0x48);
            }
          }
          _Var12._M_pi = local_3a8._M_pi;
          if (((ulong)local_3a8._M_pi & 7) == 0 && (Alloc *)local_3a8._M_pi != (Alloc *)0x0) {
            p_Var1 = local_3a8._M_pi + 3;
            *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_3a8._M_pi);
              operator_delete(_Var12._M_pi,0x48);
            }
          }
          peVar10 = local_410;
          if (((ulong)local_410 & 7) == 0 && local_410 != (element_type *)0x0) {
            pLVar4 = local_410->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_410);
              operator_delete(peVar10,0x48);
            }
          }
          peVar10 = local_4b0;
          if (((ulong)local_4b0 & 7) == 0 && local_4b0 != (element_type *)0x0) {
            pLVar4 = local_4b0->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_4b0);
              operator_delete(peVar10,0x48);
            }
          }
          peVar10 = local_400;
          if (((ulong)local_400 & 7) == 0 && local_400 != (element_type *)0x0) {
            pLVar4 = local_400->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_400);
              operator_delete(peVar10,0x48);
            }
          }
          peVar10 = local_590;
          if (((ulong)local_590 & 7) == 0 && local_590 != (element_type *)0x0) {
            pLVar4 = local_590->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_590);
              operator_delete(peVar10,0x48);
            }
          }
          peVar10 = local_5a0;
          if (((ulong)local_5a0 & 7) == 0 && local_5a0 != (element_type *)0x0) {
            pLVar4 = local_5a0->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_5a0);
              operator_delete(peVar10,0x48);
            }
          }
          peVar10 = local_5b0;
          if (((ulong)local_5b0 & 7) == 0 && local_5b0 != (element_type *)0x0) {
            pLVar4 = local_5b0->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_5b0);
              operator_delete(peVar10,0x48);
            }
          }
          peVar10 = local_5c0;
          if (((ulong)local_5c0 & 7) == 0 && local_5c0 != (element_type *)0x0) {
            pLVar4 = local_5c0->items2content_;
            *(int *)&(pLVar4->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar4->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar4->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)local_5c0);
              operator_delete(peVar10,0x48);
            }
          }
          pAVar11 = local_390;
          if (((ulong)local_390 & 7) == 0 && local_390 != (Alloc *)0x0) {
            piVar3 = &local_390->use_count;
            *piVar3 = *piVar3 + -1;
            if (*piVar3 == 0) {
              Alloc::~Alloc(local_390);
              operator_delete(pAVar11,0x48);
            }
          }
          Cavs::~Cavs(&local_90);
          Cavs::~Cavs((Cavs *)local_570);
          peVar17 = (element_type *)&peVar17[1].super_Graph.ab2b;
        } while (peVar17 != local_3d0);
      }
    }
    peVar17 = local_310;
    uVar5 = local_394;
    psVar15 = (pointer)((long)&(local_430->
                               super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + 1);
    if (psVar15 == (pointer)0x3) {
      local_150.shared_alloc_.alloc = local_4a0.shared_alloc_.alloc;
      if (((ulong)local_4a0.shared_alloc_.alloc & 7) == 0 &&
          local_4a0.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_150.shared_alloc_.alloc = (Alloc *)((local_4a0.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_4a0.shared_alloc_.alloc)->use_count =
               (local_4a0.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_150.shared_alloc_.direct_ptr = local_4a0.shared_alloc_.direct_ptr;
      Read<double>::Read((Read<signed_char> *)local_570,&local_150);
      pAVar11 = local_150.shared_alloc_.alloc;
      if (((ulong)local_150.shared_alloc_.alloc & 7) == 0 &&
          local_150.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar3 = &(local_150.shared_alloc_.alloc)->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_150.shared_alloc_.alloc);
          operator_delete(pAVar11,0x48);
        }
      }
      local_160.write_.shared_alloc_.alloc = (Alloc *)local_570._0_8_;
      if ((local_570._0_8_ & 7) == 0 && (Alloc *)local_570._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_160.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_570._0_8_ * 8 + 1);
        }
        else {
          *(int *)(local_570._0_8_ + 0x30) = *(int *)(local_570._0_8_ + 0x30) + 1;
        }
      }
      local_160.write_.shared_alloc_.direct_ptr = (void *)local_570._8_8_;
      Mesh::add_tag<double>(new_mesh,uVar5,(string *)peVar17,local_5c4,&local_160,false);
      pAVar11 = local_160.write_.shared_alloc_.alloc;
      if (((ulong)local_160.write_.shared_alloc_.alloc & 7) == 0 &&
          local_160.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar3 = &(local_160.write_.shared_alloc_.alloc)->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(pAVar11);
          operator_delete(pAVar11,0x48);
        }
      }
      plVar8 = profile::global_singleton_history;
      if (profile::global_singleton_history != (long *)0x0) {
        local_428 = *(pointer *)
                     (*profile::global_singleton_history + 0x30 +
                     profile::global_singleton_history[3] * 0x40);
        b = now();
        RVar18 = operator-(b,(Impl)((Impl *)(*plVar8 + 0x28 + plVar8[3] * 0x40))->__d);
        lVar6 = *plVar8;
        lVar7 = plVar8[3];
        *(double *)(lVar6 + 0x30 + lVar7 * 0x40) = (double)local_428 + RVar18;
        plVar8[3] = *(long *)(lVar6 + lVar7 * 0x40);
      }
      uVar9 = local_570._0_8_;
      if ((local_570._0_8_ & 7) == 0 && (Alloc *)local_570._0_8_ != (Alloc *)0x0) {
        piVar3 = (int *)(local_570._0_8_ + 0x30);
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc((Alloc *)local_570._0_8_);
          operator_delete((void *)uVar9,0x48);
        }
      }
      if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
        piVar3 = &local_120->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_120);
          operator_delete(local_120,0x48);
        }
      }
      if (((ulong)local_4a0.shared_alloc_.alloc & 7) == 0 &&
          local_4a0.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar3 = &(local_4a0.shared_alloc_.alloc)->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_4a0.shared_alloc_.alloc);
          operator_delete(local_4a0.shared_alloc_.alloc,0x48);
        }
      }
      if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
        piVar3 = &local_110->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(local_110);
          operator_delete(local_110,0x48);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

static void transfer_integ_error(Mesh* old_mesh, Mesh* new_mesh,
    CavsByBdryStatus const& cavs, Reals old_elem_densities,
    Reals new_elem_densities, std::string const& error_name,
    LOs same_ents2old_ents, LOs same_ents2new_ents,
    ConservedBools conserved_bools) {
  begin_code("transfer_integ_error");
  auto dim = old_mesh->dim();
  auto old_tag = old_mesh->get_tag<Real>(dim, error_name);
  auto ncomps = old_tag->ncomps();
  auto old_elem_errors = old_tag->array();
  auto new_elem_errors_w = Write<Real>(new_mesh->nelems() * ncomps, 0.0);
  auto same_errors = read(unmap(same_ents2old_ents, old_elem_errors, ncomps));
  map_into(same_errors, same_ents2new_ents, new_elem_errors_w, ncomps);
  for (std::size_t i = 0; i < 3; ++i) {
    if (!conserved_bools.this_time[i]) {
      for (auto class_cavs : cavs[i][CLASS_COLOR]) {
        introduce_class_integ_error(old_mesh, new_mesh, class_cavs,
            old_elem_densities, new_elem_densities, new_elem_errors_w);
      }
    }
    if (!conserved_bools.always[i]) {
      for (auto bdry_cavs : cavs[i][CLASS_COLOR]) {
        carry_class_bdry_integ_error(
            old_mesh, new_mesh, bdry_cavs, error_name, new_elem_errors_w);
      }
    }
  }
  auto new_elem_errors = Reals(new_elem_errors_w);
  new_mesh->add_tag(dim, error_name, ncomps, new_elem_errors);
  end_code();
}